

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

bool __thiscall
irr::video::CNullDriver::setRenderTarget
          (CNullDriver *this,ITexture *texture,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  dimension2d<unsigned_int> dVar2;
  pointer ppIVar3;
  ITexture *pIVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  uint uVar7;
  int iVar10;
  undefined1 auVar9 [16];
  ITexture *depthTexture;
  ITexture *local_70;
  f32 local_64;
  dimension2d<unsigned_int> *local_60;
  array<irr::video::ITexture_*> *local_58;
  string<char> local_50;
  CNullDriver *pCVar8;
  
  if (texture == (ITexture *)0x0) {
    iVar5 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                      (this,0,clearFlag,(ulong)clearColor.color,clearStencil);
    return SUB41(iVar5,0);
  }
  pCVar8 = this;
  local_64 = clearDepth;
  if (this->SharedRenderTarget == (IRenderTarget *)0x0) {
    iVar5 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x22])();
    this->SharedRenderTarget = (IRenderTarget *)CONCAT44(extraout_var,iVar5);
  }
  local_70 = (ITexture *)0x0;
  ppIVar3 = (this->SharedDepthTextures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(this->SharedDepthTextures).m_data.
                              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3);
  pIVar4 = local_70;
  if (iVar5 != 0) {
    lVar6 = 0;
    do {
      pIVar4 = ppIVar3[lVar6];
      dVar2 = pIVar4->Size;
      auVar9._0_4_ = -(uint)(dVar2.Width == (texture->Size).Width);
      iVar10 = -(uint)(dVar2.Height == (texture->Size).Height);
      auVar9._4_4_ = auVar9._0_4_;
      auVar9._8_4_ = iVar10;
      auVar9._12_4_ = iVar10;
      uVar7 = movmskpd((int)pCVar8,auVar9);
      pCVar8 = (CNullDriver *)(ulong)uVar7;
      if (uVar7 == 3) break;
      lVar6 = lVar6 + 1;
      pIVar4 = local_70;
    } while (iVar5 != (int)lVar6);
  }
  local_70 = pIVar4;
  if (local_70 == (ITexture *)0x0) {
    local_58 = &this->SharedDepthTextures;
    local_60 = &texture->Size;
    paVar1 = &local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = '\0';
    local_50.str._M_dataplus._M_p = (pointer)paVar1;
    core::string<char>::operator=(&local_50,"IRR_DEPTH_STENCIL");
    iVar5 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x14])(this,local_60,&local_50,0x10);
    local_70 = (ITexture *)CONCAT44(extraout_var_00,iVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.str._M_dataplus._M_p,
                      CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                               local_50.str.field_2._M_local_buf[0]) + 1);
    }
    core::array<irr::video::ITexture_*>::push_back(local_58,&local_70);
  }
  local_50.str._M_dataplus._M_p = (pointer)texture;
  (**this->SharedRenderTarget->_vptr_IRenderTarget)
            (this->SharedRenderTarget,&local_50,1,local_70,0,0);
  iVar5 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                    (this,this->SharedRenderTarget,clearFlag,(ulong)clearColor.color,clearStencil);
  return SUB41(iVar5,0);
}

Assistant:

bool CNullDriver::setRenderTarget(ITexture *texture, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (texture) {
		// create render target if require.
		if (!SharedRenderTarget)
			SharedRenderTarget = addRenderTarget();

		ITexture *depthTexture = 0;

		// try to find available depth texture with require size.
		for (u32 i = 0; i < SharedDepthTextures.size(); ++i) {
			if (SharedDepthTextures[i]->getSize() == texture->getSize()) {
				depthTexture = SharedDepthTextures[i];

				break;
			}
		}

		// create depth texture if require.
		if (!depthTexture) {
			depthTexture = addRenderTargetTexture(texture->getSize(), "IRR_DEPTH_STENCIL", video::ECF_D24S8);
			SharedDepthTextures.push_back(depthTexture);
		}

		SharedRenderTarget->setTexture(texture, depthTexture);

		return setRenderTargetEx(SharedRenderTarget, clearFlag, clearColor, clearDepth, clearStencil);
	} else {
		return setRenderTargetEx(0, clearFlag, clearColor, clearDepth, clearStencil);
	}
}